

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall node::backward(node *this)

{
  pointer pptVar1;
  tensor *ptVar2;
  pointer pptVar3;
  pointer pdVar4;
  tensor *ptVar5;
  undefined8 *puVar6;
  long lVar7;
  
  if (this->isbuild == true) {
    pptVar1 = (this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ptVar2 = this->ret;
    pptVar3 = (this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar4 = (this->grad_fn).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar7 = 0; (long)pptVar1 - (long)pptVar3 >> 3 != lVar7; lVar7 = lVar7 + 1) {
      ptVar5 = pptVar3[lVar7];
      ptVar5->grad = pdVar4[lVar7] * ptVar2->grad + ptVar5->grad;
      ptVar5->cnt = ptVar5->cnt + -1;
    }
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "backward before forward!";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

virtual void backward(){  //把ret的梯度传向input
        if(!isbuild)  //如果没有forward，无法传梯度。
            throw "backward before forward!";
        for(int i=0;i<input.size();i++){
            input[i]->grad+=grad_fn[i]*ret->grad;
            input[i]->cnt--;

        }
    }